

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* SoapySDR::listSearchPaths_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  istream *piVar6;
  ulong *puVar7;
  size_type *psVar8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  undefined8 uVar9;
  ulong uVar10;
  string pluginPath;
  stringstream pluginPaths;
  string local_210;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [4];
  ios_base local_130 [264];
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  getRootPath_abi_cxx11_();
  plVar4 = (long *)std::__cxx11::string::append((char *)local_1d0);
  paVar1 = &local_210.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_210.field_2._M_allocated_capacity = *puVar7;
    local_210.field_2._8_8_ = plVar4[3];
    local_210._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_210.field_2._M_allocated_capacity = *puVar7;
    local_210._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_210._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  getABIVersion_abi_cxx11_();
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    uVar9 = local_210.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1e8 + local_210._M_string_length) {
    uVar10 = 0xf;
    if (local_1f0 != local_1e0) {
      uVar10 = local_1e0[0];
    }
    if (local_1e8 + local_210._M_string_length <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
      goto LAB_00126529;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0);
LAB_00126529:
  local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
  psVar8 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_1b0[0].field_2._0_8_ = *psVar8;
    local_1b0[0].field_2._8_8_ = puVar5[3];
  }
  else {
    local_1b0[0].field_2._0_8_ = *psVar8;
    local_1b0[0]._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1b0[0]._M_string_length = puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(in_RDI,local_1b0);
  paVar2 = &local_1b0[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  getRootPath_abi_cxx11_();
  iVar3 = std::__cxx11::string::compare((char *)local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p);
  }
  if (iVar3 == 0) {
    getABIVersion_abi_cxx11_();
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x1305c3);
    psVar8 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1b0[0].field_2._0_8_ = *psVar8;
      local_1b0[0].field_2._8_8_ = puVar5[3];
      local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1b0[0].field_2._0_8_ = *psVar8;
      local_1b0[0]._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1b0[0]._M_string_length = puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(in_RDI,local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b0[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar1) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if (listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_);
      if (iVar3 != 0) {
        listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_._M_dataplus._M_p =
             (pointer)&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_,"");
        __cxa_atexit(std::__cxx11::string::~string,
                     &listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_);
      }
    }
    if ((listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_._M_string_length != 0) &&
       (*listSearchPaths[abi:cxx11]()::libsuffix_abi_cxx11_._M_dataplus._M_p == '/')) {
      getABIVersion_abi_cxx11_();
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x1305c3)
      ;
      psVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_1b0[0].field_2._0_8_ = *psVar8;
        local_1b0[0].field_2._8_8_ = puVar5[3];
        local_1b0[0]._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1b0[0].field_2._0_8_ = *psVar8;
        local_1b0[0]._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1b0[0]._M_string_length = puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(in_RDI,local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1b0[0]._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != paVar1) {
        operator_delete(local_210._M_dataplus._M_p);
      }
    }
  }
  getEnvImpl_abi_cxx11_(&local_210,"SOAPY_SDR_PLUGIN_PATH");
  std::__cxx11::stringstream::stringstream
            ((stringstream *)local_1b0,(string *)&local_210,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_210._M_string_length = 0;
  local_210.field_2._M_allocated_capacity =
       local_210.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_210._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_210,':');
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    if (local_210._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_RDI,&local_210);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> SoapySDR::listSearchPaths(void)
{
    //the default search path
    std::vector<std::string> searchPaths;
    searchPaths.push_back(SoapySDR::getRootPath() + "/lib/SoapySDR/modules" + SoapySDR::getABIVersion());

    //support /usr/local module installs when the install prefix is /usr
    if (SoapySDR::getRootPath() == "/usr")
    {
        searchPaths.push_back("/usr/local/lib/SoapySDR/modules" + SoapySDR::getABIVersion());
        //when using a multi-arch directory, support single-arch path as well
        static const std::string libsuffix("");
        if (not libsuffix.empty() and libsuffix.at(0) == '/')
            searchPaths.push_back("/usr/local/lib/SoapySDR/modules" + SoapySDR::getABIVersion());
    }

    //separator for search paths
    #ifdef _MSC_VER
    static const char sep = ';';
    #else
    static const char sep = ':';
    #endif

    //check the environment's search path
    std::stringstream pluginPaths(getEnvImpl("SOAPY_SDR_PLUGIN_PATH"));
    std::string pluginPath;
    while (std::getline(pluginPaths, pluginPath, sep))
    {
        if (pluginPath.empty()) continue;
        searchPaths.push_back(pluginPath);
    }

    return searchPaths;
}